

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMullMusashi<(moira::Core)2,(moira::Instr)156,(moira::Mode)10,4>
          (Moira *this,u16 opcode)

{
  u32 uVar1;
  uint n;
  u32 uVar2;
  int dl;
  int dh;
  int src;
  u16 ext;
  u32 data;
  u32 ea;
  u64 result;
  Moira *pMStack_10;
  u16 opcode_local;
  Moira *this_local;
  
  result._6_2_ = opcode;
  pMStack_10 = this;
  uVar1 = readI<(moira::Core)2,2>(this);
  n = (ushort)((ushort)uVar1 >> 0xc) & 7;
  readOp<(moira::Core)2,(moira::Mode)10,4,0ull>
            (this,result._6_2_ & 7,(u32 *)&stack0xffffffffffffffdc,(u32 *)&src);
  prefetch<(moira::Core)2,4ull>(this);
  switch((ushort)uVar1 >> 10 & 3) {
  case 0:
    uVar1 = readD<4>(this,n);
    _data = mullu<(moira::Core)2,2>(this,src,uVar1);
    writeD<4>(this,n,(u32)_data);
    break;
  case 1:
    uVar2 = readD<4>(this,n);
    _data = mullu<(moira::Core)2,4>(this,src,uVar2);
    writeD<4>(this,uVar1 & 7,(u32)(_data >> 0x20));
    writeD<4>(this,n,(u32)_data);
    break;
  case 2:
    uVar1 = readD<4>(this,n);
    _data = mulls<(moira::Core)2,2>(this,src,uVar1);
    writeD<4>(this,n,(u32)_data);
    break;
  case 3:
    uVar2 = readD<4>(this,n);
    _data = mulls<(moira::Core)2,4>(this,src,uVar2);
    writeD<4>(this,uVar1 & 7,(u32)(_data >> 0x20));
    writeD<4>(this,n,(u32)_data);
  }
  return;
}

Assistant:

void
Moira::execMullMusashi(u16 opcode)
{
    u64 result;
    u32 ea, data;
    u16 ext = (u16)readI<C, Word>();

    int src = _____________xxx(opcode);
    int dh  = _____________xxx(ext);
    int dl  = _xxx____________(ext);

    readOp<C, M, S>(src, &ea, &data);

    prefetch<C, POLL>();

    switch (____xx__________(ext)) {

        case 0b00:

            result = mullu<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b01:

            result = mullu<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;

        case 0b10:

            result = mulls<C, Word>(data, readD(dl));
            writeD(dl, u32(result));
            break;

        case 0b11:

            result = mulls<C, Long>(data, readD(dl));
            writeD(dh, u32(result >> 32));
            writeD(dl, u32(result));
            break;
    }
}